

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FailoverStrategy.cpp
# Opt level: O1

void __thiscall xmrig::FailoverStrategy::onLoginSuccess(FailoverStrategy *this)

{
  IClient *in_RSI;
  
  onLoginSuccess((FailoverStrategy *)
                 &this[-1].m_pools.
                  super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,in_RSI);
  return;
}

Assistant:

void xmrig::FailoverStrategy::onLoginSuccess(IClient *client)
{
    int active = m_active;

    if (client->id() == 0 || !isActive()) {
        active = client->id();
    }

    for (size_t i = 1; i < m_pools.size(); ++i) {
        if (active != static_cast<int>(i)) {
            m_pools[i]->disconnect();
        }
    }

    if (active >= 0 && active != m_active) {
        m_index = m_active = active;
        m_listener->onActive(this, client);
    }
}